

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkAigToLogicSop(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  char *pcVar12;
  uint *__ptr;
  int *pfCompl;
  Vec_Ptr_t *pVVar13;
  Abc_Ntk_t *pAVar14;
  long lVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                  ,0x101,"Abc_Ntk_t *Abc_NtkAigToLogicSop(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar10 = Abc_AigConst1(pNtk);
  if (0 < (pAVar10->vFanouts).nSize) {
    pAVar11 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pAVar10->field_6).pCopy = pAVar11;
  }
  pVVar13 = pNtk->vObjs;
  bVar7 = true;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
    do {
      pAVar10 = (Abc_Obj_t *)pVVar13->pArray[lVar15];
      if ((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) {
        Abc_NtkDupObj(pNtk_00,pAVar10,0);
        pcVar12 = Abc_SopCreateAnd2((Mem_Flex_t *)pNtk_00->pManFunc,
                                    *(uint *)&pAVar10->field_0x14 >> 10 & 1,
                                    *(uint *)&pAVar10->field_0x14 >> 0xb & 1);
        (((pAVar10->field_6).pCopy)->field_5).pData = pcVar12;
        pVVar13 = pNtk->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar13->nSize);
    if (0 < pVVar13->nSize) {
      lVar15 = 0;
      bVar7 = false;
      do {
        puVar4 = (undefined8 *)pVVar13->pArray[lVar15];
        if ((puVar4 != (undefined8 *)0x0) && ((*(uint *)((long)puVar4 + 0x14) & 0xf) == 7)) {
          if (((ulong)puVar4 & 1) != 0) {
            pcVar12 = "!Abc_ObjIsComplement(pNode)";
LAB_001e93cc:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*puVar4 != 3) {
            pcVar12 = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_001e93cc;
          }
          if ((puVar4[7] != 0) && (0 < *(int *)((long)puVar4 + 0x2c))) {
            pAVar10 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
            __ptr = (uint *)malloc(0x10);
            __ptr[0] = 0x10;
            __ptr[1] = 0;
            pfCompl = (int *)malloc(0x40);
            *(int **)(__ptr + 2) = pfCompl;
            puVar16 = puVar4;
            do {
              uVar1 = *(uint *)((long)puVar16 + 0x14);
              uVar2 = *(uint *)((long)puVar4 + 0x14);
              uVar3 = __ptr[1];
              if (uVar3 == *__ptr) {
                if ((int)uVar3 < 0x10) {
                  if (pfCompl == (int *)0x0) {
                    pfCompl = (int *)malloc(0x40);
                  }
                  else {
                    pfCompl = (int *)realloc(pfCompl,0x40);
                  }
                  *(int **)(__ptr + 2) = pfCompl;
                  uVar8 = 0x10;
                  if (pfCompl == (int *)0x0) {
LAB_001e939d:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                }
                else {
                  if (pfCompl == (int *)0x0) {
                    pfCompl = (int *)malloc((ulong)uVar3 * 8);
                  }
                  else {
                    pfCompl = (int *)realloc(pfCompl,(ulong)uVar3 * 8);
                  }
                  *(int **)(__ptr + 2) = pfCompl;
                  if (pfCompl == (int *)0x0) goto LAB_001e939d;
                  uVar8 = uVar3 * 2;
                }
                *__ptr = uVar8;
              }
              __ptr[1] = uVar3 + 1;
              pfCompl[(int)uVar3] = (uVar1 ^ uVar2) >> 7 & 1;
              Abc_ObjAddFanin(pAVar10,(Abc_Obj_t *)puVar16[8]);
              puVar16 = (undefined8 *)puVar16[7];
            } while (puVar16 != (undefined8 *)0x0);
            pcVar12 = Abc_SopCreateOrMultiCube((Mem_Flex_t *)pNtk_00->pManFunc,__ptr[1],pfCompl);
            (pAVar10->field_5).pData = pcVar12;
            *(Abc_Obj_t **)(puVar4[8] + 0x40) = pAVar10;
            free(pfCompl);
            free(__ptr);
            pVVar13 = pNtk->vObjs;
            bVar7 = true;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar13->nSize);
      bVar7 = !bVar7;
      if (0 < pVVar13->nSize) {
        lVar15 = 0;
        do {
          plVar5 = (long *)pVVar13->pArray[lVar15];
          if (((plVar5 != (long *)0x0) && ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 7)) &&
             (0 < *(int *)((long)plVar5 + 0x1c))) {
            lVar18 = 0;
            do {
              pAVar10 = *(Abc_Obj_t **)
                         (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                   (long)*(int *)(plVar5[4] + lVar18 * 4) * 8) + 0x40);
              pAVar11 = (pAVar10->field_6).pCopy;
              if (pAVar11 == (Abc_Obj_t *)0x0) {
                pAVar11 = pAVar10;
              }
              Abc_ObjAddFanin((Abc_Obj_t *)plVar5[8],pAVar11);
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)plVar5 + 0x1c));
            pVVar13 = pNtk->vObjs;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar13->nSize);
      }
    }
  }
  pVVar13 = pNtk->vCos;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
    do {
      plVar5 = (long *)pVVar13->pArray[lVar15];
      uVar6 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                  (long)*(int *)plVar5[4] * 8) + 0x40);
      uVar17 = *(ulong *)(uVar6 + 0x40);
      if (uVar17 == 0) {
        uVar17 = uVar6;
      }
      Abc_ObjAddFanin((Abc_Obj_t *)plVar5[8],
                      (Abc_Obj_t *)(uVar17 ^ *(uint *)((long)plVar5 + 0x14) >> 10 & 1));
      lVar15 = lVar15 + 1;
      pVVar13 = pNtk->vCos;
    } while (lVar15 < pVVar13->nSize);
  }
  if (bVar7) {
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  }
  else {
    Abc_NtkLogicMakeSimpleCos2(pNtk_00,0);
  }
  pAVar14 = pNtk->pExdc;
  if (pAVar14 != (Abc_Ntk_t *)0x0) {
    if (pAVar14->ntkType == ABC_NTK_STRASH) {
      pAVar14 = Abc_NtkAigToLogicSop(pAVar14);
    }
    else {
      pAVar14 = Abc_NtkDup(pAVar14);
    }
    pNtk_00->pExdc = pAVar14;
  }
  iVar9 = Abc_NtkCheck(pNtk_00);
  if (iVar9 == 0) {
    fwrite("Abc_NtkAigToLogicSop(): Network check has failed.\n",0x32,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}